

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::
Singleton<Catch::(anonymous_namespace)::RegistryHub,Catch::IRegistryHub,Catch::IMutableRegistryHub>
::~Singleton(Singleton<Catch::(anonymous_namespace)::RegistryHub,Catch::IRegistryHub,Catch::IMutableRegistryHub>
             *this)

{
  *(undefined ***)(this + -0x130) = &PTR__RegistryHub_00325ce8;
  *(undefined ***)(this + -0x128) = &PTR__RegistryHub_00325d68;
  *(undefined ***)(this + -0x20) = &PTR__EnumValuesRegistry_00325490;
  std::
  vector<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,_std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>_>_>
  ::~vector((vector<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,_std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>_>_>
             *)(this + -0x18));
  std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             *)(this + -0x38));
  *(undefined ***)(this + -0x70) = &PTR__TagAliasRegistry_00323e28;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
               *)(this + -0x68));
  *(undefined ***)(this + -0x90) = &PTR__ExceptionTranslatorRegistry_00323cb8;
  std::
  vector<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
  ::~vector((vector<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
             *)(this + -0x88));
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::~unique_ptr
            ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)(this + -0x98));
  TestRegistry::~TestRegistry((TestRegistry *)(this + -0x120));
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }